

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

bool cmPolicies::ApplyPolicyVersion(cmMakefile *mf,uint majorVer,uint minorVer,uint patchVer)

{
  bool bVar1;
  PolicyStatus PVar2;
  char *__s;
  cmState *this;
  string *psVar3;
  byte local_ea;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  undefined4 local_80;
  allocator<char> local_79;
  string local_78;
  PolicyStatus local_58 [2];
  PolicyStatus status;
  value_type local_44;
  undefined1 local_40 [4];
  PolicyID pid;
  vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> ancientPolicies;
  uint patchVer_local;
  uint minorVer_local;
  uint majorVer_local;
  cmMakefile *mf_local;
  
  ancientPolicies.super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = patchVer;
  std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::vector
            ((vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *)local_40);
  local_44 = CMP0000;
  do {
    if (local_44 == CMPCOUNT) {
      bVar1 = std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::empty
                        ((vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *)
                         local_40);
      if (bVar1) {
        mf_local._7_1_ = true;
      }
      else {
        DiagnoseAncientPolicies
                  ((vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *)local_40,
                   majorVer,minorVer,
                   ancientPolicies.
                   super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,mf);
        cmSystemTools::SetFatalErrorOccured();
        mf_local._7_1_ = false;
      }
LAB_0018eb67:
      local_80 = 1;
      std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::~vector
                ((vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *)local_40);
      return mf_local._7_1_;
    }
    bVar1 = isPolicyNewerThan(local_44,majorVer,minorVer,
                              ancientPolicies.
                              super__Vector_base<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    if (bVar1) {
      PVar2 = GetPolicyStatus(local_44);
      if (PVar2 == REQUIRED_ALWAYS) {
        std::vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_>::push_back
                  ((vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> *)local_40,
                   &local_44);
      }
      else {
        local_58[0] = WARN;
        __s = idToString(local_44);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_79);
        bVar1 = GetPolicyDefault(mf,&local_78,local_58);
        local_ea = 1;
        if (bVar1) {
          bVar1 = cmMakefile::SetPolicy(mf,local_44,local_58[0]);
          local_ea = bVar1 ^ 0xff;
        }
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator(&local_79);
        if ((local_ea & 1) != 0) {
          mf_local._7_1_ = false;
          goto LAB_0018eb67;
        }
        if ((local_44 == CMP0001) && ((local_58[0] == WARN || (local_58[0] == OLD)))) {
          this = cmMakefile::GetState(mf);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"CMAKE_BACKWARDS_COMPATIBILITY",&local_a1);
          psVar3 = cmState::GetInitializedCacheValue(this,&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::allocator<char>::~allocator(&local_a1);
          if (psVar3 == (string *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c8,"CMAKE_BACKWARDS_COMPATIBILITY",&local_c9);
            cmMakefile::AddCacheDefinition
                      (mf,&local_c8,"2.4",
                       "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                       ,STRING,false);
            std::__cxx11::string::~string((string *)&local_c8);
            std::allocator<char>::~allocator(&local_c9);
          }
        }
      }
    }
    else {
      bVar1 = cmMakefile::SetPolicy(mf,local_44,NEW);
      if (!bVar1) {
        mf_local._7_1_ = false;
        goto LAB_0018eb67;
      }
    }
    local_44 = local_44 + CMP0001;
  } while( true );
}

Assistant:

bool cmPolicies::ApplyPolicyVersion(cmMakefile* mf, unsigned int majorVer,
                                    unsigned int minorVer,
                                    unsigned int patchVer)
{
  // now loop over all the policies and set them as appropriate
  std::vector<cmPolicies::PolicyID> ancientPolicies;
  for (PolicyID pid = cmPolicies::CMP0000; pid != cmPolicies::CMPCOUNT;
       pid = PolicyID(pid + 1)) {
    if (isPolicyNewerThan(pid, majorVer, minorVer, patchVer)) {
      if (cmPolicies::GetPolicyStatus(pid) == cmPolicies::REQUIRED_ALWAYS) {
        ancientPolicies.push_back(pid);
      } else {
        cmPolicies::PolicyStatus status = cmPolicies::WARN;
        if (!GetPolicyDefault(mf, idToString(pid), &status) ||
            !mf->SetPolicy(pid, status)) {
          return false;
        }
        if (pid == cmPolicies::CMP0001 &&
            (status == cmPolicies::WARN || status == cmPolicies::OLD)) {
          if (!(mf->GetState()->GetInitializedCacheValue(
                "CMAKE_BACKWARDS_COMPATIBILITY"))) {
            // Set it to 2.4 because that is the last version where the
            // variable had meaning.
            mf->AddCacheDefinition(
              "CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
              "For backwards compatibility, what version of CMake "
              "commands and "
              "syntax should this version of CMake try to support.",
              cmStateEnums::STRING);
          }
        }
      }
    } else {
      if (!mf->SetPolicy(pid, cmPolicies::NEW)) {
        return false;
      }
    }
  }

  // Make sure the project does not use any ancient policies.
  if (!ancientPolicies.empty()) {
    DiagnoseAncientPolicies(ancientPolicies, majorVer, minorVer, patchVer, mf);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  return true;
}